

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::getChunkInfo
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  pointer puVar1;
  bool bVar2;
  size_type sVar3;
  uint uVar4;
  uchar *puVar5;
  pointer chunk;
  pointer puVar6;
  allocator<char> local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  char type [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar1 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 8;
  chunk = puVar6;
  local_68 = sizes;
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  while( true ) {
    if (puVar1 <= chunk + 8) {
      return 0;
    }
    if (chunk < puVar6) {
      return 0;
    }
    lodepng_chunk_type(type,chunk);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,type,&local_69);
    sVar3 = local_50._M_string_length;
    std::__cxx11::string::~string((string *)&local_50);
    if (sVar3 != 4) {
      return 1;
    }
    uVar4 = lodepng_chunk_length(chunk);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,type,&local_69);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_60,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    local_50._M_dataplus._M_p = (pointer)(ulong)uVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (local_68,(unsigned_long *)&local_50);
    if (puVar1 < (pointer)(ulong)uVar4 + (long)chunk + 0xc) break;
    puVar5 = lodepng_chunk_next_const(chunk);
    bVar2 = puVar5 <= chunk;
    chunk = puVar5;
    if (bVar2) {
      return 1;
    }
  }
  return 1;
}

Assistant:

unsigned getChunkInfo(std::vector<std::string>& names, std::vector<size_t>& sizes,
                      const std::vector<unsigned char>& png) {
  // Listing chunks is based on the original file, not the decoded png info.
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) return 1;

    unsigned length = lodepng_chunk_length(chunk);
    names.push_back(type);
    sizes.push_back(length);
    if(chunk + length + 12 > end) return 1;

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) return 1; // integer overflow
    chunk = next;
  }
  return 0;
}